

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O0

uint __thiscall crnlib::dxt_image::get_pixel_alpha(dxt_image *this,uint x,uint y,uint element_index)

{
  element_type eVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  dxt1_block *this_00;
  dxt5_block *this_01;
  dxt3_block *this_02;
  uint block_x_00;
  uint block_y_00;
  dxt3_block *pBlock_2;
  uint s_1;
  uint h_1;
  uint l_1;
  dxt5_block *pBlock_1;
  uint s;
  uint h;
  uint l;
  dxt1_block *pBlock;
  uint block_y;
  uint block_x;
  uint element_index_local;
  uint y_local;
  uint x_local;
  dxt_image *this_local;
  
  block_x_00 = x >> 2;
  block_y_00 = y >> 2;
  eVar1 = this->m_element_type[element_index];
  if (eVar1 != cColorDXT1) {
    if (eVar1 != cAlphaDXT3) {
      if (eVar1 != cAlphaDXT5) {
        return 0xff;
      }
      this_01 = (dxt5_block *)get_element(this,block_x_00,block_y_00,element_index);
      uVar2 = dxt5_block::get_low_alpha(this_01);
      uVar3 = dxt5_block::get_high_alpha(this_01);
      uVar4 = dxt5_block::get_selector(this_01,x & 3,y & 3);
      if (uVar3 < uVar2) {
        switch(uVar4) {
        case 0:
          return uVar2;
        case 1:
          return uVar3;
        case 2:
          return (uVar2 * 6 + uVar3) / 7;
        case 3:
          return (uVar2 * 5 + uVar3 * 2) / 7;
        case 4:
          return (uVar2 * 4 + uVar3 * 3) / 7;
        case 5:
          return (uVar2 * 3 + uVar3 * 4) / 7;
        case 6:
          return (uVar2 * 2 + uVar3 * 5) / 7;
        case 7:
          return (uVar2 + uVar3 * 6) / 7;
        }
      }
      else {
        switch(uVar4) {
        case 0:
          return uVar2;
        case 1:
          return uVar3;
        case 2:
          return (uVar2 * 4 + uVar3) / 5;
        case 3:
          return (uVar2 * 3 + uVar3 * 2) / 5;
        case 4:
          return (uVar2 * 2 + uVar3 * 3) / 5;
        case 5:
          return (uVar2 + uVar3 * 4) / 5;
        case 6:
          return 0;
        case 7:
          return 0xff;
        }
      }
    }
    this_02 = (dxt3_block *)get_element(this,block_x_00,block_y_00,element_index);
    uVar2 = dxt3_block::get_alpha(this_02,x & 3,y & 3,true);
    return uVar2;
  }
  if (cDXT1A < this->m_format) {
    return 0xff;
  }
  this_00 = (dxt1_block *)get_element(this,block_x_00,block_y_00,element_index);
  uVar2 = dxt1_block::get_low_color(this_00);
  uVar3 = dxt1_block::get_high_color(this_00);
  if (uVar3 < uVar2) {
    return 0xff;
  }
  uVar2 = dxt1_block::get_selector(this_00,x & 3,y & 3);
  if (uVar2 == 3) {
    return 0;
  }
  return 0xff;
}

Assistant:

uint dxt_image::get_pixel_alpha(uint x, uint y, uint element_index) const
    {
        CRNLIB_ASSERT((x < m_width) && (y < m_height) && (element_index < m_num_elements_per_block));

        const uint block_x = x >> cDXTBlockShift;
        const uint block_y = y >> cDXTBlockShift;

        switch (m_element_type[element_index])
        {
        case cColorDXT1:
        {
            if (m_format <= cDXT1A)
            {
                const dxt1_block* pBlock = reinterpret_cast<const dxt1_block*>(&get_element(block_x, block_y, element_index));

                const uint l = pBlock->get_low_color();
                const uint h = pBlock->get_high_color();

                if (l <= h)
                {
                    uint s = pBlock->get_selector(x & 3, y & 3);

                    return (s == 3) ? 0 : 255;
                }
                else
                {
                    return 255;
                }
            }

            break;
        }
        case cAlphaDXT5:
        {
            const dxt5_block* pBlock = reinterpret_cast<const dxt5_block*>(&get_element(block_x, block_y, element_index));

            const uint l = pBlock->get_low_alpha();
            const uint h = pBlock->get_high_alpha();

            const uint s = pBlock->get_selector(x & 3, y & 3);

            if (l > h)
            {
                switch (s)
                {
                case 0:
                    return l;
                case 1:
                    return h;
                case 2:
                    return (l * 6 + h) / 7;
                case 3:
                    return (l * 5 + h * 2) / 7;
                case 4:
                    return (l * 4 + h * 3) / 7;
                case 5:
                    return (l * 3 + h * 4) / 7;
                case 6:
                    return (l * 2 + h * 5) / 7;
                case 7:
                    return (l + h * 6) / 7;
                }
            }
            else
            {
                switch (s)
                {
                case 0:
                    return l;
                case 1:
                    return h;
                case 2:
                    return (l * 4 + h) / 5;
                case 3:
                    return (l * 3 + h * 2) / 5;
                case 4:
                    return (l * 2 + h * 3) / 5;
                case 5:
                    return (l + h * 4) / 5;
                case 6:
                    return 0;
                case 7:
                    return 255;
                }
            }
        }
        case cAlphaDXT3:
        {
            const dxt3_block* pBlock = reinterpret_cast<const dxt3_block*>(&get_element(block_x, block_y, element_index));

            return pBlock->get_alpha(x & 3, y & 3, true);
        }
        default:
            break;
        }

        return 255;
    }